

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ColumnSetExpr(Parse *pParse,Table *pTab,Column *pCol,Expr *pExpr)

{
  ushort uVar1;
  Expr *p;
  ExprList *pEVar2;
  int iVar3;
  
  pEVar2 = (pTab->u).tab.pDfltList;
  uVar1 = pCol->iDflt;
  if (pEVar2 == (ExprList *)0x0 || uVar1 == 0) {
    if (pEVar2 == (ExprList *)0x0) {
      pCol->iDflt = 1;
      pEVar2 = sqlite3ExprListAppendNew(pParse->db,pExpr);
      goto LAB_0018ceea;
    }
    iVar3 = pEVar2->nExpr;
  }
  else {
    iVar3 = pEVar2->nExpr;
    if ((int)(uint)uVar1 <= iVar3) {
      p = pEVar2->a[uVar1 - 1].pExpr;
      if (p != (Expr *)0x0) {
        sqlite3ExprDeleteNN(pParse->db,p);
        uVar1 = pCol->iDflt;
      }
      pEVar2->a[(ulong)uVar1 - 1].pExpr = pExpr;
      return;
    }
  }
  pCol->iDflt = (short)iVar3 + 1;
  pEVar2 = sqlite3ExprListAppend(pParse,pEVar2,pExpr);
LAB_0018ceea:
  (pTab->u).tab.pDfltList = pEVar2;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnSetExpr(
  Parse *pParse,    /* Parsing context */
  Table *pTab,      /* The table containing the column */
  Column *pCol,     /* The column to receive the new DEFAULT expression */
  Expr *pExpr       /* The new default expression */
){
  ExprList *pList;
  assert( IsOrdinaryTable(pTab) );
  pList = pTab->u.tab.pDfltList;
  if( pCol->iDflt==0
   || NEVER(pList==0)
   || NEVER(pList->nExpr<pCol->iDflt)
  ){
    pCol->iDflt = pList==0 ? 1 : pList->nExpr+1;
    pTab->u.tab.pDfltList = sqlite3ExprListAppend(pParse, pList, pExpr);
  }else{
    sqlite3ExprDelete(pParse->db, pList->a[pCol->iDflt-1].pExpr);
    pList->a[pCol->iDflt-1].pExpr = pExpr;
  }
}